

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O1

void __thiscall
StringFormatter::format
          (StringFormatter *this,Value *value,function<void_(const_char_*,_unsigned_long)> *output)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar2;
  StringFormatter *pSVar3;
  bool bVar4;
  int iVar5;
  time_t t;
  _Rb_tree_node_base *p_Var6;
  anon_union_48_10_37e00c34_for_mData *paVar7;
  long lVar8;
  List<String> strings;
  String str;
  char buf [128];
  vector<String,_std::allocator<String>_> local_158;
  Date local_138;
  StringFormatter *local_130;
  _Rb_tree_node_base *local_128;
  _Base_ptr local_120;
  _Rb_tree_node_base *local_118;
  _Rb_tree_node_base *local_110;
  _Rb_tree_node_base local_108;
  code *local_e8;
  code *pcStack_e0;
  undefined1 local_d8 [128];
  _Rb_tree_node_base *local_58;
  _Any_data local_50;
  code *local_40;
  
  local_118 = &local_108;
  local_110 = (_Rb_tree_node_base *)0x0;
  local_108._M_color._0_1_ = _S_red;
  switch(value->mType) {
  case Type_Invalid:
  case Type_Undefined:
    local_d8._0_8_ = "null";
    local_158.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x4;
    if ((output->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0016c5f7;
    (*output->_M_invoker)((_Any_data *)output,(char **)local_d8,(unsigned_long *)&local_158);
    break;
  case Type_Boolean:
    bVar4 = Value::convert<bool>(value,(bool *)0x0);
    if (bVar4) {
      local_d8._0_8_ = "true";
      local_158.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x4;
      if ((output->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0016c5f7;
      (*output->_M_invoker)((_Any_data *)output,(char **)local_d8,(unsigned_long *)&local_158);
    }
    else {
      local_d8._0_8_ = "false";
      local_158.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x5;
      if ((output->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0016c5f7;
      (*output->_M_invoker)((_Any_data *)output,(char **)local_d8,(unsigned_long *)&local_158);
    }
    break;
  case Type_Integer:
    iVar5 = snprintf((char *)local_d8,0x80,"%d",(ulong)(uint)(value->mData).integer);
    local_138.mTime = (time_t)iVar5;
    local_158.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_d8;
    if ((output->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0016c601;
    (*output->_M_invoker)((_Any_data *)output,(char **)&local_158,(unsigned_long *)&local_138);
    break;
  case Type_Double:
    iVar5 = snprintf((char *)local_d8,0x80,"%g",(int)(value->mData).llong);
    local_138.mTime = (time_t)iVar5;
    local_158.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_d8;
    if ((output->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0016c5fc;
    (*output->_M_invoker)((_Any_data *)output,(char **)&local_158,(unsigned_long *)&local_138);
    break;
  case Type_String:
    Value::convert<String>((String *)local_d8,value,(bool *)0x0);
    goto LAB_0016c21f;
  case Type_Custom:
    plVar1 = (long *)(value->mData).voidPtr;
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&value->mData + 8);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    (**(code **)(*plVar1 + 0x10))(local_d8);
    std::__cxx11::string::operator=((string *)&local_118,(string *)local_d8);
    if ((_Rb_tree_node_base *)local_d8._0_8_ != (_Rb_tree_node_base *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    break;
  case Type_Map:
    local_158.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_158.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_158.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    this->indent = this->indent + 1;
    local_128 = (_Rb_tree_node_base *)((long)&value->mData + 8);
    local_130 = this;
    if (value->mType != Type_Map) {
      if (Value::end()::hack == '\0') goto LAB_0016c610;
      p_Var6 = (_Rb_tree_node_base *)(Value::end()::hack + 8);
      goto LAB_0016c3bf;
    }
    p_Var6 = *(_Rb_tree_node_base **)((long)&value->mData + 0x18);
    goto LAB_0016c3bf;
  case Type_List:
    lVar2 = *(long *)((long)&value->mData + 8);
    local_d8._0_8_ = "[ ";
    local_158.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x1;
    if ((output->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0016c606;
    (*output->_M_invoker)((_Any_data *)output,(char **)local_d8,(unsigned_long *)&local_158);
    if (value->mType == Type_List) {
LAB_0016c2d1:
      paVar7 = &value->mData;
    }
    else {
      if (Value::listEnd()::hack != '\0') {
        value = (Value *)Value::listEnd()::hack;
        goto LAB_0016c2d1;
      }
      format();
      paVar7 = (anon_union_48_10_37e00c34_for_mData *)local_d8._0_8_;
    }
    lVar8 = paVar7->llong;
    if (lVar8 != lVar2) {
      bVar4 = true;
      do {
        if (bVar4) {
          bVar4 = false;
        }
        else {
          local_d8._0_8_ = ", ";
          local_158.super__Vector_base<String,_std::allocator<String>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x1;
          if ((output->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0016c5f2;
          (*output->_M_invoker)((_Any_data *)output,(char **)local_d8,(unsigned_long *)&local_158);
        }
        std::function<void_(const_char_*,_unsigned_long)>::function
                  ((function<void_(const_char_*,_unsigned_long)> *)&local_50,output);
        (*(this->super_Formatter)._vptr_Formatter[2])(this,lVar8,&local_50);
        if (local_40 != (code *)0x0) {
          (*local_40)(&local_50,&local_50,__destroy_functor);
        }
        lVar8 = lVar8 + 0x38;
      } while (lVar8 != lVar2);
    }
    local_d8._0_8_ = " ]";
    local_158.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x2;
    if ((output->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0016c60b;
    (*output->_M_invoker)((_Any_data *)output,(char **)local_d8,(unsigned_long *)&local_158);
    break;
  case Type_Date:
    Date::Date((Date *)&local_158,(value->mData).llong,UTC);
    local_138.mTime =
         (time_t)local_158.super__Vector_base<String,_std::allocator<String>_>._M_impl.
                 super__Vector_impl_data._M_start;
    t = Date::time(&local_138,(time_t *)0x1);
    String::formatTime((String *)local_d8,t,DateTime);
LAB_0016c21f:
    std::__cxx11::string::operator=((string *)&local_118,(string *)local_d8);
    if ((_Rb_tree_node_base *)local_d8._0_8_ != (_Rb_tree_node_base *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_);
    }
  }
  do {
    if (local_110 == (_Rb_tree_node_base *)0x0) {
LAB_0016c5cc:
      if (local_118 != &local_108) {
        operator_delete(local_118);
      }
      return;
    }
    local_d8._0_8_ = local_118;
    local_158.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_110;
    if ((output->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*output->_M_invoker)((_Any_data *)output,(char **)local_d8,(unsigned_long *)&local_158);
      goto LAB_0016c5cc;
    }
LAB_0016c5f7:
    while( true ) {
      std::__throw_bad_function_call();
LAB_0016c5fc:
      std::__throw_bad_function_call();
LAB_0016c601:
      std::__throw_bad_function_call();
LAB_0016c606:
      std::__throw_bad_function_call();
LAB_0016c60b:
      std::__throw_bad_function_call();
LAB_0016c610:
      format();
      p_Var6 = (_Rb_tree_node_base *)local_d8._0_8_;
LAB_0016c3bf:
      pSVar3 = local_130;
      if (p_Var6 == local_128) break;
      while( true ) {
        String::format<128ul>
                  ((String *)local_d8,"%*s%s: ",(ulong)(pSVar3->indent - 1)," ",
                   *(undefined8 *)(p_Var6 + 1));
        local_108._M_right = (_Base_ptr)0x0;
        pcStack_e0 = std::
                     _Function_handler<void_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Value.cpp:263:36)>
                     ::_M_invoke;
        local_e8 = std::
                   _Function_handler<void_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Value.cpp:263:36)>
                   ::_M_manager;
        local_108._M_left = (_Base_ptr)local_d8;
        local_58 = p_Var6;
        (*(pSVar3->super_Formatter)._vptr_Formatter[2])(pSVar3,p_Var6 + 2,&local_108._M_left);
        if (local_e8 != (code *)0x0) {
          (*local_e8)(&local_108._M_left,&local_108._M_left,3);
        }
        local_138.mTime = local_d8._0_8_;
        local_120 = (_Base_ptr)local_d8._8_8_;
        if ((output->super__Function_base)._M_manager == (_Manager_type)0x0) break;
        (*output->_M_invoker)((_Any_data *)output,(char **)&local_138,(unsigned_long *)&local_120);
        local_138.mTime = (long)".[\\*^$\n" + 6;
        local_120 = (_Base_ptr)0x1;
        if ((output->super__Function_base)._M_manager == (_Manager_type)0x0) break;
        (*output->_M_invoker)((_Any_data *)output,(char **)&local_138,(unsigned_long *)&local_120);
        if ((_Rb_tree_node_base *)local_d8._0_8_ != (_Rb_tree_node_base *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_58);
        if (p_Var6 == local_128) goto LAB_0016c503;
      }
      std::__throw_bad_function_call();
LAB_0016c5f2:
      std::__throw_bad_function_call();
    }
LAB_0016c503:
    local_130->indent = local_130->indent + -1;
    std::vector<String,_std::allocator<String>_>::~vector(&local_158);
  } while( true );
}

Assistant:

virtual void format(const Value &value, std::function<void(const char *, size_t)> output) const
    {
        String str;
        switch (value.type()) {
        case Value::Type_Invalid:
        case Value::Type_Undefined:
            output("null", 4);
            break;
        case Value::Type_Boolean:
            if (value.toBool()) {
                output("true", 4);
            } else {
                output("false", 5);
            }
            break;
        case Value::Type_Integer: {
            char buf[128];
            const size_t w = snprintf(buf, sizeof(buf), "%d", value.toInteger());
            output(buf, w);
            break; }
        case Value::Type_Double: {
            char buf[128];
            const size_t w = snprintf(buf, sizeof(buf), "%g", value.toDouble());
            output(buf, w);
            break; }
        case Value::Type_String:
            str = value.toString();
            break;
        case Value::Type_Custom:
            str = value.toCustom()->toString();
            break;
        case Value::Type_Map: {
            const auto end = value.end();
            List<String> strings;
            ++indent;
            for (auto it = value.begin(); it != end; ++it) {
                // printf("%*s" "%s", indent, " ", string);
                String s = String::format<128>("%*s%s: ", indent - 1, " ", it->first.constData());
                format(it->second, [&s](const char *ch, size_t len) {
                        s.append(ch, len);
                    });
                output(s.constData(), s.size());
                output("\n", 1);
            }
            --indent;
            break; }
        case Value::Type_List: {
            const auto end = value.listEnd();
            output("[ ", 1);
            bool first = true;
            for (auto it = value.listBegin(); it != end; ++it) {
                if (!first) {
                    output(", ", 1);
                } else {
                    first = false;
                }
                format(*it, output);
            }
            output(" ]", 2);
            break; }
        case Value::Type_Date:
            str = String::formatTime(value.toDate().time());
            break;
        }
        if (!str.isEmpty())
            output(str.constData(), str.size());
    }